

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O3

void dPrint_Dense_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  puVar2 = (uint *)A->Store;
  uVar1 = *puVar2;
  printf("\nDense matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  lVar5 = *(long *)(puVar2 + 2);
  printf("nrow %d, ncol %d, lda %d\n",(ulong)(uint)A->nrow,(ulong)(uint)A->ncol,(ulong)uVar1);
  printf("\nnzval: ");
  if (0 < A->ncol) {
    lVar4 = 0;
    do {
      if (0 < A->nrow) {
        lVar3 = 0;
        do {
          printf("%f  ",*(undefined8 *)(lVar5 + lVar3 * 8));
          lVar3 = lVar3 + 1;
        } while (lVar3 < A->nrow);
      }
      putchar(10);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + (long)(int)uVar1 * 8;
    } while (lVar4 < A->ncol);
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
dPrint_Dense_Matrix(char *what, SuperMatrix *A)
{
    DNformat     *Astore = (DNformat *) A->Store;
    register int i, j, lda = Astore->lda;
    double       *dp;
    
    printf("\nDense matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    dp = (double *) Astore->nzval;
    printf("nrow %d, ncol %d, lda %d\n", (int)A->nrow, (int)A->ncol, lda);
    printf("\nnzval: ");
    for (j = 0; j < A->ncol; ++j) {
        for (i = 0; i < A->nrow; ++i) printf("%f  ", dp[i + j*lda]);
        printf("\n");
    }
    printf("\n");
    fflush(stdout);
}